

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ColumnSizeCb(void *pContext,int tflags,char *pUnused,int nUnused,int iUnused1,int iUnused2)

{
  int *pCnt;
  int iUnused2_local;
  int iUnused1_local;
  int nUnused_local;
  char *pUnused_local;
  int tflags_local;
  void *pContext_local;
  
  if ((tflags & 1U) == 0) {
    *(int *)pContext = *pContext + 1;
  }
  return 0;
}

Assistant:

static int fts5ColumnSizeCb(
  void *pContext,                 /* Pointer to int */
  int tflags,
  const char *pUnused,            /* Buffer containing token */
  int nUnused,                    /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int *pCnt = (int*)pContext;
  UNUSED_PARAM2(pUnused, nUnused);
  UNUSED_PARAM2(iUnused1, iUnused2);
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ){
    (*pCnt)++;
  }
  return SQLITE_OK;
}